

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nicdrv.c
# Opt level: O3

int ecx_waitinframe_red(ecx_portt *port,int idx,osal_timert *timer)

{
  int iVar1;
  ecx_redportt *peVar2;
  ec_bufT *pauVar3;
  boolean bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  osal_timert timer2;
  osal_timert local_38;
  
  iVar6 = -(uint)(port->redstate != 0);
  iVar5 = -1;
  do {
    if (iVar5 < 0) {
      iVar5 = ecx_inframe(port,idx,0);
    }
    if ((port->redstate != 0) && (iVar6 < 0)) {
      iVar6 = ecx_inframe(port,idx,1);
    }
  } while (((iVar5 < 0) || (iVar6 < 0)) && (bVar4 = osal_timer_is_expired(timer), bVar4 == '\0'));
  if (port->redstate != 0) {
    if (iVar5 < 0) {
      iVar7 = 0;
    }
    else {
      iVar7 = port->rxsa[idx];
    }
    if (-1 < iVar6) {
      iVar1 = port->redport->rxsa[idx];
      if ((iVar7 == 0x404) && (iVar1 == 0x101)) {
        pauVar3 = port->redport->rxbuf + (long)idx + -1;
LAB_0010d998:
        memcpy(port->rxbuf + idx,pauVar3 + 1,(long)port->txbuflength[idx] - 0xe);
        iVar5 = iVar6;
      }
      else {
        if ((iVar7 != 0) || (iVar1 != 0x404)) {
          if (iVar7 != 0x101) {
            return iVar5;
          }
          if (iVar1 != 0x404) {
            return iVar5;
          }
          memcpy(port->txbuf[idx] + 0xe,port->rxbuf + idx,(long)port->txbuflength[idx] - 0xe);
        }
        osal_timer_start(&local_38,2000);
        peVar2 = port->redport;
        send(*(peVar2->stack).sock,*(peVar2->stack).txbuf + idx,
             (long)(*(peVar2->stack).txbuflength)[idx],0);
        (*(peVar2->stack).rxbufstat)[idx] = 2;
        do {
          iVar6 = ecx_inframe(port,idx,1);
          if (-1 < iVar6) {
            pauVar3 = port->redport->rxbuf + (long)idx + -1;
            goto LAB_0010d998;
          }
          bVar4 = osal_timer_is_expired(&local_38);
        } while (bVar4 == '\0');
      }
    }
  }
  return iVar5;
}

Assistant:

static int ecx_waitinframe_red(ecx_portt *port, int idx, osal_timert *timer)
{
   osal_timert timer2;
   int wkc  = EC_NOFRAME;
   int wkc2 = EC_NOFRAME;
   int primrx, secrx;
   
   /* if not in redundant mode then always assume secondary is OK */
   if (port->redstate == ECT_RED_NONE)
      wkc2 = 0;
   do 
   {
      /* only read frame if not already in */
      if (wkc <= EC_NOFRAME)
         wkc  = ecx_inframe(port, idx, 0);
      /* only try secondary if in redundant mode */
      if (port->redstate != ECT_RED_NONE)
      {   
         /* only read frame if not already in */
         if (wkc2 <= EC_NOFRAME)
            wkc2 = ecx_inframe(port, idx, 1);
      }   
   /* wait for both frames to arrive or timeout */   
   } while (((wkc <= EC_NOFRAME) || (wkc2 <= EC_NOFRAME)) && !osal_timer_is_expired(timer));
   /* only do redundant functions when in redundant mode */
   if (port->redstate != ECT_RED_NONE)
   {
      /* primrx if the reveived MAC source on primary socket */
      primrx = 0;
      if (wkc > EC_NOFRAME) primrx = port->rxsa[idx];
      /* secrx if the reveived MAC source on psecondary socket */
      secrx = 0;
      if (wkc2 > EC_NOFRAME) secrx = port->redport->rxsa[idx];
      
      /* primary socket got secondary frame and secondary socket got primary frame */
      /* normal situation in redundant mode */
      if ( ((primrx == RX_SEC) && (secrx == RX_PRIM)) )
      {
         /* copy secondary buffer to primary */
         memcpy(&(port->rxbuf[idx]), &(port->redport->rxbuf[idx]), port->txbuflength[idx] - ETH_HEADERSIZE);
         wkc = wkc2;
      }   
      /* primary socket got nothing or primary frame, and secondary socket got secondary frame */
      /* we need to resend TX packet */ 
      if ( ((primrx == 0) && (secrx == RX_SEC)) ||
           ((primrx == RX_PRIM) && (secrx == RX_SEC)) )
      {
         /* If both primary and secondary have partial connection retransmit the primary received
          * frame over the secondary socket. The result from the secondary received frame is a combined
          * frame that traversed all slaves in standard order. */
         if ( (primrx == RX_PRIM) && (secrx == RX_SEC) )
         {   
            /* copy primary rx to tx buffer */
            memcpy(&(port->txbuf[idx][ETH_HEADERSIZE]), &(port->rxbuf[idx]), port->txbuflength[idx] - ETH_HEADERSIZE);
         }
         osal_timer_start (&timer2, EC_TIMEOUTRET);
         /* resend secondary tx */
         ecx_outframe(port, idx, 1);
         do 
         {
            /* retrieve frame */
            wkc2 = ecx_inframe(port, idx, 1);
         } while ((wkc2 <= EC_NOFRAME) && !osal_timer_is_expired(&timer2));
         if (wkc2 > EC_NOFRAME)
         {   
            /* copy secondary result to primary rx buffer */
            memcpy(&(port->rxbuf[idx]), &(port->redport->rxbuf[idx]), port->txbuflength[idx] - ETH_HEADERSIZE);
            wkc = wkc2;
         }   
      }      
   }
   
   /* return WKC or EC_NOFRAME */
   return wkc;
}